

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdi::ControllerWidget::paintEvent(ControllerWidget *this,QPaintEvent *param_2)

{
  QStyle *pQVar1;
  long in_RDI;
  undefined8 in_R9;
  long in_FS_OFFSET;
  QPainter painter;
  QStyleOptionComplex opt;
  QStyleOptionComplex *in_stack_ffffffffffffff78;
  SubControl flags;
  QWidget *this_00;
  QStyleOptionComplex *in_stack_ffffffffffffff80;
  undefined1 *local_60 [2];
  undefined1 local_50 [8];
  QFlags<QStyle::StateFlag> aQStack_48 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_50,0xaa,0x48);
  QStyleOptionComplex::QStyleOptionComplex
            (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (int)in_stack_ffffffffffffff78);
  initStyleOption((ControllerWidget *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  flags = (SubControl)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if (*(int *)(in_RDI + 0x28) == *(int *)(in_RDI + 0x2c)) {
    QFlags<QStyle::SubControl>::QFlags
              ((QFlags<QStyle::SubControl> *)in_stack_ffffffffffffff80,flags);
    aQStack_48[0xf].super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)local_60[1]._4_4_;
    QFlags<QStyle::StateFlag>::operator|=(aQStack_48,State_Sunken);
  }
  else if ((*(int *)(in_RDI + 0x2c) != 0) && (*(int *)(in_RDI + 0x28) == 0)) {
    QFlags<QStyle::SubControl>::QFlags
              ((QFlags<QStyle::SubControl> *)in_stack_ffffffffffffff80,flags);
    aQStack_48[0xf].super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)local_60[1]._0_4_;
    QFlags<QStyle::StateFlag>::operator|=(aQStack_48,State_MouseOver);
  }
  local_60[0] = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QWidget *)local_60;
  QPainter::QPainter((QPainter *)this_00,(QPaintDevice *)(in_RDI + 0x10));
  pQVar1 = QWidget::style(this_00);
  (**(code **)(*(long *)pQVar1 + 200))(pQVar1,8,local_50,this_00,in_RDI,in_R9,this_00,local_50);
  QPainter::~QPainter((QPainter *)this_00);
  QStyleOptionComplex::~QStyleOptionComplex((QStyleOptionComplex *)0x62b652);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ControllerWidget::paintEvent(QPaintEvent * /*paintEvent*/)
{
    QStyleOptionComplex opt;
    initStyleOption(&opt);
    if (activeControl == hoverControl) {
        opt.activeSubControls = activeControl;
        opt.state |= QStyle::State_Sunken;
    } else if (hoverControl != QStyle::SC_None && (activeControl == QStyle::SC_None)) {
        opt.activeSubControls = hoverControl;
        opt.state |= QStyle::State_MouseOver;
    }
    QPainter painter(this);
    style()->drawComplexControl(QStyle::CC_MdiControls, &opt, &painter, this);
}